

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O1

Endpoint * __thiscall prometheus::Exposer::GetEndpointForUri(Exposer *this,string *uri)

{
  pointer pcVar1;
  unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
  *puVar2;
  Endpoint *pEVar3;
  _Head_base<0UL,_prometheus::detail::Endpoint_*,_false> _Var4;
  bool bVar5;
  pointer *__ptr;
  long lVar6;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  __it;
  __normal_iterator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_*,_std::vector<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>_>
  __it_00;
  anon_class_32_1_ba1d80cc_for__M_pred sameUri;
  _Head_base<0UL,_prometheus::detail::Endpoint_*,_false> local_d8;
  long local_d0;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 local_a0 [16];
  __uniq_ptr_impl<prometheus::detail::MetricsHandler,_std::default_delete<prometheus::detail::MetricsHandler>_>
  local_90;
  unique_ptr<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
  local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (uri->_M_dataplus)._M_p;
  local_c8._16_8_ = uri;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + uri->_M_string_length);
  __it_00._M_current =
       (this->endpoints_).
       super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->endpoints_).
           super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b0._M_allocated_capacity = (size_type)(local_c8 + 0x28);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_c8 + 0x18),local_50,local_50 + local_48);
  local_90._M_t.
  super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
  .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl =
       (tuple<prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
        )local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_b0._M_allocated_capacity,
             (undefined1 *)(local_b0._8_8_ + local_b0._M_allocated_capacity));
  local_d8._M_head_impl = (Endpoint *)local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,
             local_90._M_t.
             super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
             .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl,
             (undefined1 *)
             ((long)local_88._M_t.
                    super___uniq_ptr_impl<prometheus::BasicAuthHandler,_std::default_delete<prometheus::BasicAuthHandler>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_prometheus::BasicAuthHandler_*,_std::default_delete<prometheus::BasicAuthHandler>_>
                    .super__Head_base<0UL,_prometheus::BasicAuthHandler_*,_false>._M_head_impl +
             (long)local_90._M_t.
                   super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
                   .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl)
            );
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_d8._M_head_impl,
             (undefined1 *)((long)&(local_d8._M_head_impl)->server_ + local_d0));
  if (local_d8._M_head_impl != (Endpoint *)local_c8) {
    operator_delete(local_d8._M_head_impl);
  }
  local_d8._M_head_impl = (Endpoint *)local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_70,local_70 + local_68);
  lVar6 = (long)puVar2 - (long)__it_00._M_current >> 5;
  if (0 < lVar6) {
    lVar6 = lVar6 + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_d8,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar5) goto LAB_001093d8;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_d8,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar5) goto LAB_001093d8;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_d8,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar5) goto LAB_001093d8;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
              operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                          *)&local_d8,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar5) goto LAB_001093d8;
      __it_00._M_current = __it_00._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)puVar2 - (long)__it_00._M_current >> 3;
  if (lVar6 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar6 != 2) {
      __it._M_current = puVar2;
      if ((lVar6 != 3) ||
         (bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>
                  ::operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                                *)&local_d8,__it_00), __it._M_current = __it_00._M_current, bVar5))
      goto LAB_001093d8;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
            operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                        *)&local_d8,__it);
    if (bVar5) goto LAB_001093d8;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar5 = __gnu_cxx::__ops::
          _Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::$_0>::
          operator()((_Iter_pred<prometheus::Exposer::GetEndpointForUri(std::__cxx11::string_const&)::__0>
                      *)&local_d8,__it_00);
  __it._M_current = puVar2;
  if (bVar5) {
    __it._M_current = __it_00._M_current;
  }
LAB_001093d8:
  if (local_d8._M_head_impl != (Endpoint *)local_c8) {
    operator_delete(local_d8._M_head_impl);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_90._M_t.
      super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
      .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
       )local_80) {
    operator_delete((void *)local_90._M_t.
                            super__Tuple_impl<0UL,_prometheus::detail::MetricsHandler_*,_std::default_delete<prometheus::detail::MetricsHandler>_>
                            .super__Head_base<0UL,_prometheus::detail::MetricsHandler_*,_false>.
                            _M_head_impl);
  }
  if ((undefined1 *)local_b0._M_allocated_capacity != local_c8 + 0x28) {
    operator_delete((void *)local_b0._M_allocated_capacity);
  }
  if (__it._M_current ==
      (this->endpoints_).
      super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    detail::make_unique<prometheus::detail::Endpoint,CivetServer&,std::__cxx11::string_const&>
              ((detail *)&local_d8,
               (this->server_)._M_t.
               super___uniq_ptr_impl<CivetServer,_std::default_delete<CivetServer>_>._M_t.
               super__Tuple_impl<0UL,_CivetServer_*,_std::default_delete<CivetServer>_>.
               super__Head_base<0UL,_CivetServer_*,_false>._M_head_impl,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8._16_8_)
    ;
    std::
    vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
    ::
    emplace_back<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>
              ((vector<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>,std::allocator<std::unique_ptr<prometheus::detail::Endpoint,std::default_delete<prometheus::detail::Endpoint>>>>
                *)&this->endpoints_,
               (unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
                *)&local_d8);
    _Var4._M_head_impl = local_d8._M_head_impl;
    if (local_d8._M_head_impl != (Endpoint *)0x0) {
      detail::Endpoint::~Endpoint(local_d8._M_head_impl);
      operator_delete(_Var4._M_head_impl);
    }
    __it._M_current =
         (this->endpoints_).
         super__Vector_base<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>,_std::allocator<std::unique_ptr<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  pEVar3 = ((__it._M_current)->_M_t).
           super___uniq_ptr_impl<prometheus::detail::Endpoint,_std::default_delete<prometheus::detail::Endpoint>_>
           ._M_t.
           super__Tuple_impl<0UL,_prometheus::detail::Endpoint_*,_std::default_delete<prometheus::detail::Endpoint>_>
           .super__Head_base<0UL,_prometheus::detail::Endpoint_*,_false>._M_head_impl;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return pEVar3;
}

Assistant:

detail::Endpoint& Exposer::GetEndpointForUri(const std::string& uri) {
  auto sameUri = [uri](const std::unique_ptr<detail::Endpoint>& endpoint) {
    return endpoint->GetURI() == uri;
  };
  auto it = std::find_if(std::begin(endpoints_), std::end(endpoints_), sameUri);
  if (it != std::end(endpoints_)) {
    return *it->get();
  }

  endpoints_.emplace_back(detail::make_unique<detail::Endpoint>(*server_, uri));
  return *endpoints_.back().get();
}